

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateFunctionMapFactory.cpp
# Opt level: O3

ElementFunctionMap * COLLADASaxFWL15::FunctionMapFactory::createFunctionMap__COLLADA__1level(void)

{
  mapped_type *pmVar1;
  
  if (createFunctionMap__COLLADA__1level()::functionMap == '\0') {
    createFunctionMap__COLLADA__1level();
  }
  if (createFunctionMap__COLLADA__1level()::mapFilled == '\0') {
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,&HASH_ELEMENT_COLLADA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__COLLADA;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__COLLADA;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__COLLADA;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__COLLADA;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__COLLADA;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__COLLADA;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,&HASH_ELEMENT_ASSET);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,&HASH_ELEMENT_EXTRA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_ANIMATION_CLIPS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_animation_clips;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_ANIMATIONS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_animations;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_animations;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_animations;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_animations;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_animations;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_animations;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_ARTICULATED_SYSTEMS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_articulated_systems
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_articulated_systems;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_articulated_systems;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_articulated_systems;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__library_articulated_systems;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_articulated_systems;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_CAMERAS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_cameras;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_cameras;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_cameras;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__library_cameras;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_cameras;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__library_cameras;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_CONTROLLERS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_controllers;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_controllers;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_controllers;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_controllers;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_controllers;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_controllers;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_EFFECTS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_effects;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_effects;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_effects;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__library_effects;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_effects;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__library_effects;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_FORCE_FIELDS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_force_fields
    ;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_force_fields;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_FORMULAS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_formulas;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_formulas;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_formulas;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__library_formulas
    ;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_formulas;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__library_formulas
    ;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_GEOMETRIES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_geometries;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_geometries;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_geometries;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_geometries;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_geometries;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_geometries;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_IMAGES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_images;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_images;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_images
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__library_images;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_images;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__library_images;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_JOINTS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_joints;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_joints;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_joints
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__library_joints;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_joints;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__library_joints;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_KINEMATICS_MODELS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_kinematics_models;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_kinematics_models;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_kinematics_models;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_kinematics_models;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__library_kinematics_models;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_kinematics_models;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_KINEMATICS_SCENES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_kinematics_scenes;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_kinematics_scenes;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_kinematics_scenes;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_kinematics_scenes;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__library_kinematics_scenes;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_kinematics_scenes;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_LIGHTS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_lights;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_lights;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_lights
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__library_lights;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_lights;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__library_lights;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_MATERIALS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_materials;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_materials;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_materials;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_materials;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_materials;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_materials;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_NODES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_nodes;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_nodes;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_nodes;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__library_nodes;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_nodes;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__library_nodes;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_MATERIALS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_physics_materials;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_MODELS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_physics_models;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_SCENES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_physics_scenes;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_VISUAL_SCENES);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_visual_scenes;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,&HASH_ELEMENT_SCENE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__scene;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__scene;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__scene;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__scene;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__scene;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__scene;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    createFunctionMap__COLLADA__1level()::mapFilled = '\x01';
  }
  return &createFunctionMap__COLLADA__1level::functionMap;
}

Assistant:

const ColladaParserAutoGen15Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__COLLADA__1level() {
static ColladaParserAutoGen15Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__COLLADA, &ColladaParserAutoGen15Private::_data__COLLADA, &ColladaParserAutoGen15Private::_end__COLLADA, &ColladaParserAutoGen15Private::_preBegin__COLLADA, &ColladaParserAutoGen15Private::_preEnd__COLLADA, &ColladaParserAutoGen15Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATION_CLIPS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_animation_clips, &ColladaParserAutoGen15Private::_data__library_animation_clips, &ColladaParserAutoGen15Private::_end__library_animation_clips, &ColladaParserAutoGen15Private::_preBegin__library_animation_clips, &ColladaParserAutoGen15Private::_preEnd__library_animation_clips, &ColladaParserAutoGen15Private::_freeAttributes__library_animation_clips);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATIONS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_animations, &ColladaParserAutoGen15Private::_data__library_animations, &ColladaParserAutoGen15Private::_end__library_animations, &ColladaParserAutoGen15Private::_preBegin__library_animations, &ColladaParserAutoGen15Private::_preEnd__library_animations, &ColladaParserAutoGen15Private::_freeAttributes__library_animations);
functionMap[HASH_ELEMENT_LIBRARY_ARTICULATED_SYSTEMS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_articulated_systems, &ColladaParserAutoGen15Private::_data__library_articulated_systems, &ColladaParserAutoGen15Private::_end__library_articulated_systems, &ColladaParserAutoGen15Private::_preBegin__library_articulated_systems, &ColladaParserAutoGen15Private::_preEnd__library_articulated_systems, &ColladaParserAutoGen15Private::_freeAttributes__library_articulated_systems);
functionMap[HASH_ELEMENT_LIBRARY_CAMERAS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_cameras, &ColladaParserAutoGen15Private::_data__library_cameras, &ColladaParserAutoGen15Private::_end__library_cameras, &ColladaParserAutoGen15Private::_preBegin__library_cameras, &ColladaParserAutoGen15Private::_preEnd__library_cameras, &ColladaParserAutoGen15Private::_freeAttributes__library_cameras);
functionMap[HASH_ELEMENT_LIBRARY_CONTROLLERS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_controllers, &ColladaParserAutoGen15Private::_data__library_controllers, &ColladaParserAutoGen15Private::_end__library_controllers, &ColladaParserAutoGen15Private::_preBegin__library_controllers, &ColladaParserAutoGen15Private::_preEnd__library_controllers, &ColladaParserAutoGen15Private::_freeAttributes__library_controllers);
functionMap[HASH_ELEMENT_LIBRARY_EFFECTS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_effects, &ColladaParserAutoGen15Private::_data__library_effects, &ColladaParserAutoGen15Private::_end__library_effects, &ColladaParserAutoGen15Private::_preBegin__library_effects, &ColladaParserAutoGen15Private::_preEnd__library_effects, &ColladaParserAutoGen15Private::_freeAttributes__library_effects);
functionMap[HASH_ELEMENT_LIBRARY_FORCE_FIELDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_force_fields, &ColladaParserAutoGen15Private::_data__library_force_fields, &ColladaParserAutoGen15Private::_end__library_force_fields, &ColladaParserAutoGen15Private::_preBegin__library_force_fields, &ColladaParserAutoGen15Private::_preEnd__library_force_fields, &ColladaParserAutoGen15Private::_freeAttributes__library_force_fields);
functionMap[HASH_ELEMENT_LIBRARY_FORMULAS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_formulas, &ColladaParserAutoGen15Private::_data__library_formulas, &ColladaParserAutoGen15Private::_end__library_formulas, &ColladaParserAutoGen15Private::_preBegin__library_formulas, &ColladaParserAutoGen15Private::_preEnd__library_formulas, &ColladaParserAutoGen15Private::_freeAttributes__library_formulas);
functionMap[HASH_ELEMENT_LIBRARY_GEOMETRIES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_geometries, &ColladaParserAutoGen15Private::_data__library_geometries, &ColladaParserAutoGen15Private::_end__library_geometries, &ColladaParserAutoGen15Private::_preBegin__library_geometries, &ColladaParserAutoGen15Private::_preEnd__library_geometries, &ColladaParserAutoGen15Private::_freeAttributes__library_geometries);
functionMap[HASH_ELEMENT_LIBRARY_IMAGES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_images, &ColladaParserAutoGen15Private::_data__library_images, &ColladaParserAutoGen15Private::_end__library_images, &ColladaParserAutoGen15Private::_preBegin__library_images, &ColladaParserAutoGen15Private::_preEnd__library_images, &ColladaParserAutoGen15Private::_freeAttributes__library_images);
functionMap[HASH_ELEMENT_LIBRARY_JOINTS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_joints, &ColladaParserAutoGen15Private::_data__library_joints, &ColladaParserAutoGen15Private::_end__library_joints, &ColladaParserAutoGen15Private::_preBegin__library_joints, &ColladaParserAutoGen15Private::_preEnd__library_joints, &ColladaParserAutoGen15Private::_freeAttributes__library_joints);
functionMap[HASH_ELEMENT_LIBRARY_KINEMATICS_MODELS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_kinematics_models, &ColladaParserAutoGen15Private::_data__library_kinematics_models, &ColladaParserAutoGen15Private::_end__library_kinematics_models, &ColladaParserAutoGen15Private::_preBegin__library_kinematics_models, &ColladaParserAutoGen15Private::_preEnd__library_kinematics_models, &ColladaParserAutoGen15Private::_freeAttributes__library_kinematics_models);
functionMap[HASH_ELEMENT_LIBRARY_KINEMATICS_SCENES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_kinematics_scenes, &ColladaParserAutoGen15Private::_data__library_kinematics_scenes, &ColladaParserAutoGen15Private::_end__library_kinematics_scenes, &ColladaParserAutoGen15Private::_preBegin__library_kinematics_scenes, &ColladaParserAutoGen15Private::_preEnd__library_kinematics_scenes, &ColladaParserAutoGen15Private::_freeAttributes__library_kinematics_scenes);
functionMap[HASH_ELEMENT_LIBRARY_LIGHTS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_lights, &ColladaParserAutoGen15Private::_data__library_lights, &ColladaParserAutoGen15Private::_end__library_lights, &ColladaParserAutoGen15Private::_preBegin__library_lights, &ColladaParserAutoGen15Private::_preEnd__library_lights, &ColladaParserAutoGen15Private::_freeAttributes__library_lights);
functionMap[HASH_ELEMENT_LIBRARY_MATERIALS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_materials, &ColladaParserAutoGen15Private::_data__library_materials, &ColladaParserAutoGen15Private::_end__library_materials, &ColladaParserAutoGen15Private::_preBegin__library_materials, &ColladaParserAutoGen15Private::_preEnd__library_materials, &ColladaParserAutoGen15Private::_freeAttributes__library_materials);
functionMap[HASH_ELEMENT_LIBRARY_NODES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_nodes, &ColladaParserAutoGen15Private::_data__library_nodes, &ColladaParserAutoGen15Private::_end__library_nodes, &ColladaParserAutoGen15Private::_preBegin__library_nodes, &ColladaParserAutoGen15Private::_preEnd__library_nodes, &ColladaParserAutoGen15Private::_freeAttributes__library_nodes);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MATERIALS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_physics_materials, &ColladaParserAutoGen15Private::_data__library_physics_materials, &ColladaParserAutoGen15Private::_end__library_physics_materials, &ColladaParserAutoGen15Private::_preBegin__library_physics_materials, &ColladaParserAutoGen15Private::_preEnd__library_physics_materials, &ColladaParserAutoGen15Private::_freeAttributes__library_physics_materials);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MODELS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_physics_models, &ColladaParserAutoGen15Private::_data__library_physics_models, &ColladaParserAutoGen15Private::_end__library_physics_models, &ColladaParserAutoGen15Private::_preBegin__library_physics_models, &ColladaParserAutoGen15Private::_preEnd__library_physics_models, &ColladaParserAutoGen15Private::_freeAttributes__library_physics_models);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_SCENES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_physics_scenes, &ColladaParserAutoGen15Private::_data__library_physics_scenes, &ColladaParserAutoGen15Private::_end__library_physics_scenes, &ColladaParserAutoGen15Private::_preBegin__library_physics_scenes, &ColladaParserAutoGen15Private::_preEnd__library_physics_scenes, &ColladaParserAutoGen15Private::_freeAttributes__library_physics_scenes);
functionMap[HASH_ELEMENT_LIBRARY_VISUAL_SCENES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_visual_scenes, &ColladaParserAutoGen15Private::_data__library_visual_scenes, &ColladaParserAutoGen15Private::_end__library_visual_scenes, &ColladaParserAutoGen15Private::_preBegin__library_visual_scenes, &ColladaParserAutoGen15Private::_preEnd__library_visual_scenes, &ColladaParserAutoGen15Private::_freeAttributes__library_visual_scenes);
functionMap[HASH_ELEMENT_SCENE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__scene, &ColladaParserAutoGen15Private::_data__scene, &ColladaParserAutoGen15Private::_end__scene, &ColladaParserAutoGen15Private::_preBegin__scene, &ColladaParserAutoGen15Private::_preEnd__scene, &ColladaParserAutoGen15Private::_freeAttributes__scene);
mapFilled = true;
}
return functionMap;
}